

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# person.cpp
# Opt level: O2

void __thiscall Person::recieve(Person *this,string *origin,string *message)

{
  ostream *poVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  ostringstream out;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"[");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1,"\'s chat]: ");
  poVar1 = std::operator<<(poVar1,(string *)origin);
  poVar1 = std::operator<<(poVar1,": \'");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_1b8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_1b8);
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->m_chat_log,origin);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>(this_00,message);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void Person::recieve(const std::string& origin, const std::string& message)
{
	std::ostringstream out;
	out << "[" << m_name << "'s chat]: "
		<< origin << ": '" << message << "'";

	std::cout << out.str() << std::endl;
	m_chat_log[origin].emplace_back(message);
}